

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O1

Vec_Ptr_t * Fra_SmlSortUsingOnes(Fra_Sml_t *p,int fLatchCorr)

{
  int *piVar1;
  size_t __size;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  void *__s;
  void *__s_00;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  
  uVar12 = p->nWordsTotal;
  if ((int)uVar12 < 1) {
    __assert_fail("p->nWordsTotal > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                  ,0x9f,"Vec_Ptr_t *Fra_SmlSortUsingOnes(Fra_Sml_t *, int)");
  }
  pVVar6 = p->pAig->vObjs;
  iVar4 = pVVar6->nSize;
  lVar15 = (long)iVar4;
  __s = malloc(lVar15 * 4);
  memset(__s,0,lVar15 * 4);
  if (0 < lVar15) {
    ppvVar7 = pVVar6->pArray;
    iVar8 = 0;
    lVar13 = 0;
    do {
      if (ppvVar7[lVar13] != (void *)0x0) {
        uVar14 = (ulong)p->nWordsPref;
        iVar11 = 0;
        if (p->nWordsPref < (int)uVar12) {
          iVar11 = 0;
          do {
            uVar10 = *(uint *)((long)&p[1].pAig + uVar14 * 4 + (long)iVar8 * 4);
            uVar10 = (uVar10 >> 1 & 0x55555555) + (uVar10 & 0x55555555);
            uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
            uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
            uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
            iVar11 = (uVar10 >> 0x10) + iVar11 + (uVar10 & 0xffff);
            uVar14 = uVar14 + 1;
          } while (uVar12 != uVar14);
        }
        *(int *)((long)__s + lVar13 * 4) = iVar11;
      }
      lVar13 = lVar13 + 1;
      iVar8 = iVar8 + uVar12;
    } while (lVar13 != lVar15);
  }
  uVar16 = uVar12 * 0x20;
  uVar10 = uVar16 + 1;
  __size = (ulong)uVar10 * 4;
  __s_00 = malloc(__size);
  memset(__s_00,0,__size);
  iVar8 = 0;
  if (0 < iVar4) {
    ppvVar7 = pVVar6->pArray;
    lVar13 = 0;
    do {
      if ((lVar13 != 0) && (ppvVar7[lVar13] != (void *)0x0)) {
        uVar9 = (uint)*(undefined8 *)((long)ppvVar7[lVar13] + 0x18) & 7;
        if (fLatchCorr == 0) {
          if ((uVar9 == 2) || (uVar9 - 5 < 2)) goto LAB_006936dd;
        }
        else if (uVar9 == 2) {
LAB_006936dd:
          uVar9 = *(uint *)((long)__s + lVar13 * 4);
          if (uVar9 != uVar16 && SBORROW4(uVar9,uVar16) == (int)(uVar9 + uVar12 * -0x20) < 0) {
            __assert_fail("pnBits[i] <= nBits",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                          ,0xb8,"Vec_Ptr_t *Fra_SmlSortUsingOnes(Fra_Sml_t *, int)");
          }
          piVar1 = (int *)((long)__s_00 + (long)(int)uVar9 * 4);
          *piVar1 = *piVar1 + 1;
          iVar8 = iVar8 + 1;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar15 != lVar13);
  }
  iVar4 = iVar8 + uVar16 + 1;
  pvVar5 = malloc((long)iVar4 << 2);
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar10;
  ppvVar7 = (void **)malloc((ulong)uVar10 << 3);
  pVVar6->pArray = ppvVar7;
  pVVar6->nSize = 1;
  *ppvVar7 = pvVar5;
  uVar12 = pVVar6->nCap;
  uVar14 = 1;
  if (1 < (int)uVar16) {
    uVar14 = (ulong)uVar16;
  }
  uVar17 = 1;
  do {
    iVar8 = *(int *)((long)__s_00 + uVar17 * 4 + -4);
    if ((uint)uVar17 == uVar12) {
      if ((int)uVar12 < 0x10) {
        if (ppvVar7 == (void **)0x0) {
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(ppvVar7,0x80);
        }
        uVar12 = 0x10;
      }
      else {
        uVar10 = uVar12 * 2;
        if (SBORROW4(uVar12,uVar10) != 0 < (int)uVar12) {
          uVar12 = uVar10;
          if (ppvVar7 == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar10 << 3);
          }
          else {
            ppvVar7 = (void **)realloc(ppvVar7,(ulong)uVar10 << 3);
          }
        }
      }
    }
    pvVar5 = (void *)((long)pvVar5 + (long)iVar8 * 4 + 4);
    ppvVar7[uVar17] = pvVar5;
    uVar18 = uVar17 + 1;
    bVar19 = uVar17 != uVar14;
    uVar17 = uVar18;
  } while (bVar19);
  pVVar6->nSize = (int)uVar18;
  pVVar6->nCap = uVar12;
  pVVar6->pArray = ppvVar7;
  iVar8 = 0;
  memset(__s_00,0,__size);
  pVVar3 = p->pAig->vObjs;
  if (0 < pVVar3->nSize) {
    ppvVar7 = pVVar3->pArray;
    lVar15 = 0;
    do {
      if ((lVar15 != 0) && (ppvVar7[lVar15] != (void *)0x0)) {
        uVar12 = (uint)*(undefined8 *)((long)ppvVar7[lVar15] + 0x18) & 7;
        if (fLatchCorr == 0) {
          if ((uVar12 == 2) || (uVar12 - 5 < 2)) goto LAB_00693853;
        }
        else if (uVar12 == 2) {
LAB_00693853:
          iVar11 = *(int *)((long)__s + lVar15 * 4);
          lVar13 = (long)iVar11;
          if ((lVar13 < 0) || (pVVar6->nSize <= iVar11)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar5 = pVVar6->pArray[lVar13];
          iVar11 = *(int *)((long)__s_00 + lVar13 * 4);
          *(int *)((long)__s_00 + lVar13 * 4) = iVar11 + 1;
          *(int *)((long)pvVar5 + (long)iVar11 * 4) = (int)lVar15;
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar3->nSize);
  }
  iVar11 = pVVar6->nSize;
  if (0 < (long)iVar11) {
    ppvVar7 = pVVar6->pArray;
    lVar15 = 0;
    iVar8 = 0;
    do {
      pvVar5 = ppvVar7[lVar15];
      iVar2 = *(int *)((long)__s_00 + lVar15 * 4);
      *(int *)((long)__s_00 + lVar15 * 4) = iVar2 + 1;
      *(undefined4 *)((long)pvVar5 + (long)iVar2 * 4) = 0;
      iVar8 = iVar8 + iVar2 + 1;
      lVar15 = lVar15 + 1;
    } while (iVar11 != lVar15);
  }
  if (iVar8 != iVar4) {
    __assert_fail("nTotal == nNodes + nBits + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                  ,0xe3,"Vec_Ptr_t *Fra_SmlSortUsingOnes(Fra_Sml_t *, int)");
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Fra_SmlSortUsingOnes( Fra_Sml_t * p, int fLatchCorr )
{
    Aig_Obj_t * pObj;
    Vec_Ptr_t * vNodes;
    int i, nNodes, nTotal, nBits, * pnNodes, * pnBits, * pMemory;
    assert( p->nWordsTotal > 0 );
    // count 1s in each node's siminfo
    pnBits = Fra_SmlCountOnes( p );
    // count number of nodes having that many 1s
    nNodes = 0;
    nBits = p->nWordsTotal * 32;
    pnNodes = ABC_ALLOC( int, nBits + 1 );
    memset( pnNodes, 0, sizeof(int) * (nBits + 1) );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( i == 0 ) continue;
        // skip non-PI and non-internal nodes
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
        }
        // skip nodes participating in the classes
//        if ( Fra_ClassObjRepr(pObj) )
//            continue;
        assert( pnBits[i] <= nBits ); // "<" because of normalized info
        pnNodes[pnBits[i]]++;
        nNodes++;
    }
    // allocate memory for all the nodes
    pMemory = ABC_ALLOC( int, nNodes + nBits + 1 );  
    // markup the memory for each node
    vNodes = Vec_PtrAlloc( nBits + 1 );
    Vec_PtrPush( vNodes, pMemory );
    for ( i = 1; i <= nBits; i++ )
    {
        pMemory += pnNodes[i-1] + 1;
        Vec_PtrPush( vNodes, pMemory );
    }
    // add the nodes
    memset( pnNodes, 0, sizeof(int) * (nBits + 1) );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( i == 0 ) continue;
        // skip non-PI and non-internal nodes
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
        }
        // skip nodes participating in the classes
//        if ( Fra_ClassObjRepr(pObj) )
//            continue;
        pMemory = (int *)Vec_PtrEntry( vNodes, pnBits[i] );
        pMemory[ pnNodes[pnBits[i]]++ ] = i;
    }
    // add 0s in the end
    nTotal = 0;
    Vec_PtrForEachEntry( int *, vNodes, pMemory, i )
    {
        pMemory[ pnNodes[i]++ ] = 0;
        nTotal += pnNodes[i];
    }
    assert( nTotal == nNodes + nBits + 1 );
    ABC_FREE( pnNodes );
    ABC_FREE( pnBits );
    return vNodes;
}